

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_write_null_bytes(mtar_t *tar,size_t n)

{
  int iVar1;
  undefined1 local_2d;
  undefined4 local_2c;
  char nul;
  ulong uStack_28;
  int err;
  size_t i;
  size_t n_local;
  mtar_t *tar_local;
  
  local_2d = 0;
  uStack_28 = 0;
  i = n;
  n_local = (size_t)tar;
  while( true ) {
    if (i <= uStack_28) {
      return 0;
    }
    iVar1 = mtar_twrite((mtar_t *)n_local,&local_2d,1);
    if (iVar1 != 0) break;
    uStack_28 = uStack_28 + 1;
    local_2c = 0;
  }
  return iVar1;
}

Assistant:

static int mtar_write_null_bytes(mtar_t *tar, size_t n) {
  size_t i;
  int err;
  char nul = '\0';
  for (i = 0; i < n; i++) {
    err = mtar_twrite(tar, &nul, 1);
    if (err) {
      return err;
    }
  }
  return MTAR_ESUCCESS;
}